

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::CallCFunction(State *this,Value *f,int expect_result)

{
  int *piVar1;
  int in_EDX;
  Value *in_RSI;
  State *in_RDI;
  int i_2;
  int i_1;
  int count;
  int i;
  Value *dst;
  Value *src;
  int res_count;
  CFunctionType cfunc;
  CallInfo callee;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *in_stack_ffffffffffffffa0;
  Value *local_58;
  int local_4c;
  CFunctionType local_48;
  CallInfo local_40;
  int local_14;
  Value *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  CallInfo::CallInfo(&local_40);
  local_40.register_ = local_10 + 1;
  local_40.func_ = local_10;
  local_40.expect_result_ = local_14;
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::push_back
            (in_stack_ffffffffffffffa0,
             (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_48 = (local_10->field_0).cfunc_;
  ClearCFunctionError(in_RDI);
  local_4c = (*local_48)(in_RDI);
  CheckCFunctionError((State *)callee.end_);
  local_58 = (Value *)0x0;
  if (0 < local_4c) {
    local_58 = (in_RDI->stack_).top_ + -(long)local_4c;
  }
  if (local_14 == -1) {
    for (iVar2 = 0; iVar2 < local_4c; iVar2 = iVar2 + 1) {
      local_10->field_0 = local_58->field_0;
      local_10->type_ = local_58->type_;
      local_10 = local_10 + 1;
      local_58 = local_58 + 1;
    }
  }
  else {
    piVar1 = std::min<int>(&local_14,&local_4c);
    iVar2 = *piVar1;
    for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < iVar2;
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      local_10->field_0 = local_58->field_0;
      local_10->type_ = local_58->type_;
      local_10 = local_10 + 1;
      local_58 = local_58 + 1;
    }
    iVar2 = local_14 - local_4c;
    for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < iVar2;
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
      Value::SetNil(local_10);
      local_10 = local_10 + 1;
    }
  }
  Stack::SetNewTop((Stack *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (Value *)in_RDI);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::pop_back
            ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void State::CallCFunction(Value *f, int expect_result)
    {
        // Push the c function CallInfo
        CallInfo callee;
        callee.register_ = f + 1;
        callee.func_ = f;
        callee.expect_result_ = expect_result;
        calls_.push_back(callee);

        // Call c function
        CFunctionType cfunc = f->cfunc_;
        ClearCFunctionError();
        int res_count = cfunc(this);
        CheckCFunctionError();

        Value *src = nullptr;
        if (res_count > 0)
            src = stack_.top_ - res_count;

        // Copy c function result to caller stack
        Value *dst = f;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < res_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int count = std::min(expect_result, res_count);
            for (int i = 0; i < count; ++i)
                *dst++ = *src++;
            // Set all remain expect results to nil
            count = expect_result - res_count;
            for (int i = 0; i < count; ++i, ++dst)
                dst->SetNil();
        }

        // Set registers which after dst to nil
        // and set new stack top pointer
        stack_.SetNewTop(dst);

        // Pop the c function CallInfo
        calls_.pop_back();
    }